

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdemo_tools.cxx
# Opt level: O3

void __thiscall xrdemo_tools::process(xrdemo_tools *this,cl_parser *cl)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  xr_envelope *pxVar4;
  bool bVar5;
  xr_reader *pxVar6;
  xr_key *pxVar7;
  _Alloc_hider source;
  ulong uVar8;
  batch_helper *this_00;
  char *format;
  int iVar9;
  ulong uVar10;
  float fVar11;
  string target;
  fmatrix xform;
  xr_obj_motion omotion;
  float local_130 [4];
  string local_120;
  batch_helper *local_100;
  cl_parser *local_f8;
  size_t local_f0;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_e8;
  xr_obj_motion local_a0;
  
  this_00 = &this->super_batch_helper;
  bVar5 = batch_helper::prepare_target_name(this_00,cl);
  if ((bVar5) && (local_f0 = cl->m_num_params, local_f0 != 0)) {
    uVar10 = 0;
    local_100 = this_00;
    local_f8 = cl;
    do {
      source._M_p = cl->m_options[cl->m_argc + ~uVar10].name;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      batch_helper::make_target_name(this_00,&local_120,source._M_p,".anm");
      xray_re::xr_obj_motion::xr_obj_motion(&local_a0);
      if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
         (iVar9 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar9 != 0))
      {
        xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
        __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                     &xray_re::xr_file_system::instance::instance0,&__dso_handle);
        __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
      }
      pxVar6 = xray_re::xr_file_system::r_open
                         (&xray_re::xr_file_system::instance::instance0,source._M_p);
      if (pxVar6 == (xr_reader *)0x0) {
LAB_0014c4ee:
        format = "can\'t load %s";
LAB_0014c4f5:
        xray_re::msg(format,source._M_p);
      }
      else {
        puVar1 = pxVar6->m_data;
        puVar2 = pxVar6->m_end;
        if (puVar2 < puVar1) {
          __assert_fail("m_data <= m_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                        ,0x7a,"size_t xray_re::xr_reader::size() const");
        }
        if (((long)puVar2 - (long)puVar1 == 0) || (((int)puVar2 - (int)puVar1 & 0x3fU) != 0)) {
          (*pxVar6->_vptr_xr_reader[1])(pxVar6);
          goto LAB_0014c4ee;
        }
        xray_re::xr_obj_motion::create_envelopes(&local_a0);
        uVar8 = 0;
        iVar9 = 0;
        do {
          pxVar4 = local_a0.m_envelopes[0];
          puVar3 = (pxVar6->field_2).m_p;
          local_e8._0_8_ = *(undefined8 *)puVar3;
          local_e8._8_8_ = *(undefined8 *)(puVar3 + 8);
          local_e8._16_8_ = *(undefined8 *)(puVar3 + 0x10);
          local_e8._24_8_ = *(undefined8 *)(puVar3 + 0x18);
          local_e8._32_8_ = *(undefined8 *)(puVar3 + 0x20);
          local_e8._40_8_ = *(undefined8 *)(puVar3 + 0x28);
          local_e8._48_8_ = *(undefined8 *)(puVar3 + 0x30);
          local_e8._56_8_ = *(undefined8 *)(puVar3 + 0x38);
          (pxVar6->field_2).m_p = puVar3 + 0x40;
          pxVar7 = (xr_key *)operator_new(0x28);
          fVar11 = (float)(int)uVar8;
          pxVar7->value = local_e8.field_0._41;
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          pxVar4 = local_a0.m_envelopes[1];
          pxVar7 = (xr_key *)operator_new(0x28);
          pxVar7->value = local_e8.field_0._42;
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          pxVar4 = local_a0.m_envelopes[2];
          pxVar7 = (xr_key *)operator_new(0x28);
          pxVar7->value = local_e8.field_0._43;
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          xray_re::_matrix<float>::get_hpb
                    ((_matrix<float> *)&local_e8.field_0,local_130,local_130 + 1,local_130 + 2);
          pxVar4 = local_a0.m_envelopes[4];
          local_130[0] = 0.0;
          local_130[1] = 0.0;
          local_130[2] = 0.0;
          pxVar7 = (xr_key *)operator_new(0x28);
          pxVar7->value = 0.0;
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          pxVar4 = local_a0.m_envelopes[3];
          pxVar7 = (xr_key *)operator_new(0x28);
          pxVar7->value = local_130[1];
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          pxVar4 = local_a0.m_envelopes[5];
          pxVar7 = (xr_key *)operator_new(0x28);
          pxVar7->value = local_130[2];
          pxVar7->time = fVar11;
          pxVar7->shape = '\0';
          pxVar7->tension = 0.0;
          pxVar7->continuity = 0.0;
          pxVar7->bias = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[0] = 0.0;
          pxVar7->param[1] = 0.0;
          pxVar7->param[2] = 0.0;
          pxVar7->param[3] = 0.0;
          xray_re::xr_envelope::insert_key(pxVar4,pxVar7);
          iVar9 = iVar9 + 0x1e;
          uVar8 = uVar8 + 1;
        } while ((ulong)((long)puVar2 - (long)puVar1) >> 6 != uVar8);
        local_a0.super_xr_motion.m_frame_start = 0;
        local_a0.super_xr_motion.m_frame_end = iVar9;
        (*pxVar6->_vptr_xr_reader[1])(pxVar6);
        bVar5 = xray_re::xr_obj_motion::save_anm(&local_a0,local_120._M_dataplus._M_p);
        this_00 = local_100;
        cl = local_f8;
        if (!bVar5) {
          format = "can\'t save %s";
          source._M_p = local_120._M_dataplus._M_p;
          goto LAB_0014c4f5;
        }
      }
      xray_re::xr_obj_motion::~xr_obj_motion(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_f0);
  }
  return;
}

Assistant:

void xrdemo_tools::process(const cl_parser& cl)
{
	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		std::string target;
		make_target_name(target, source, ".anm");
		xr_obj_motion omotion;
		if (load_xrdemo(omotion, source)) {
			if (!omotion.save_anm(target.c_str()))
				msg("can't save %s", target.c_str());
		} else {
			msg("can't load %s", source);
		}
	}
}